

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detokenize.c
# Opt level: O0

void decode_color_map_tokens(Av1ColorMapParam *param,aom_reader *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 *puVar5;
  int iVar6;
  int *in_RDI;
  int i_2;
  int i_1;
  int color_idx;
  int color_ctx;
  int j;
  int i;
  int cols;
  int rows;
  int plane_block_height;
  int plane_block_width;
  MapCdf color_map_cdf;
  uint8_t *color_map;
  int n;
  uint8_t color_order [8];
  aom_cdf_prob *cdf;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int local_5c;
  int local_58;
  int local_54;
  int local_48;
  int local_44;
  undefined1 local_18 [24];
  
  puVar5 = *(undefined1 **)(in_RDI + 6);
  iVar1 = in_RDI[3];
  iVar2 = in_RDI[4];
  iVar3 = *in_RDI;
  iVar4 = in_RDI[1];
  iVar6 = av1_read_uniform((aom_reader *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                           in_stack_ffffffffffffff94);
  *puVar5 = (char)iVar6;
  for (local_44 = 1; local_44 < iVar3 + iVar4 + -1; local_44 = local_44 + 1) {
    if (local_44 < iVar4 + -1) {
      local_5c = local_44;
    }
    else {
      local_5c = iVar4 + -1;
    }
    local_48 = local_5c;
    while( true ) {
      if ((local_44 - iVar3) + 1 < 0) {
        iVar6 = 0;
      }
      else {
        iVar6 = (local_44 - iVar3) + 1;
      }
      if (local_48 < iVar6) break;
      cdf = (aom_cdf_prob *)0x0;
      av1_get_palette_color_index_context
                (color_map,color_map_cdf._4_4_,(int)color_map_cdf,plane_block_width,
                 plane_block_height,_cols,(int *)color_order);
      iVar6 = aom_read_symbol_((aom_reader *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),cdf,0);
      puVar5[(local_44 - local_48) * iVar1 + local_48] = local_18[iVar6];
      local_48 = local_48 + -1;
    }
  }
  local_58 = iVar3;
  if (iVar4 < iVar1) {
    for (local_54 = 0; local_54 < iVar3; local_54 = local_54 + 1) {
      memset(puVar5 + (long)iVar4 + (long)(local_54 * iVar1),
             (uint)(byte)puVar5[local_54 * iVar1 + iVar4 + -1],(long)(iVar1 - iVar4));
    }
  }
  for (; local_58 < iVar2; local_58 = local_58 + 1) {
    memcpy(puVar5 + local_58 * iVar1,puVar5 + (iVar3 + -1) * iVar1,(long)iVar1);
  }
  return;
}

Assistant:

static void decode_color_map_tokens(Av1ColorMapParam *param, aom_reader *r) {
  uint8_t color_order[PALETTE_MAX_SIZE];
  const int n = param->n_colors;
  uint8_t *const color_map = param->color_map;
  MapCdf color_map_cdf = param->map_cdf;
  int plane_block_width = param->plane_width;
  int plane_block_height = param->plane_height;
  int rows = param->rows;
  int cols = param->cols;

  // The first color index.
  color_map[0] = av1_read_uniform(r, n);
  assert(color_map[0] < n);

  // Run wavefront on the palette map index decoding.
  for (int i = 1; i < rows + cols - 1; ++i) {
    for (int j = AOMMIN(i, cols - 1); j >= AOMMAX(0, i - rows + 1); --j) {
      const int color_ctx = av1_get_palette_color_index_context(
          color_map, plane_block_width, (i - j), j, n, color_order, NULL);
      const int color_idx = aom_read_symbol(
          r, color_map_cdf[n - PALETTE_MIN_SIZE][color_ctx], n, ACCT_STR);
      assert(color_idx >= 0 && color_idx < n);
      color_map[(i - j) * plane_block_width + j] = color_order[color_idx];
    }
  }
  // Copy last column to extra columns.
  if (cols < plane_block_width) {
    for (int i = 0; i < rows; ++i) {
      memset(color_map + i * plane_block_width + cols,
             color_map[i * plane_block_width + cols - 1],
             (plane_block_width - cols));
    }
  }
  // Copy last row to extra rows.
  for (int i = rows; i < plane_block_height; ++i) {
    memcpy(color_map + i * plane_block_width,
           color_map + (rows - 1) * plane_block_width, plane_block_width);
  }
}